

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O0

void __thiscall
CMU462::HalfedgeMesh::buildSubdivisionFaceList
          (HalfedgeMesh *this,
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *subDFaces)

{
  initializer_list<unsigned_long> __l;
  bool bVar1;
  pointer pFVar2;
  HalfedgeIter *pHVar3;
  pointer pHVar4;
  pointer pVVar5;
  pointer pEVar6;
  HalfedgeMesh *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  HalfedgeIter it2;
  HalfedgeIter it;
  FaceIter f;
  HalfedgeMesh *in_stack_ffffffffffffff48;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_ffffffffffffff50;
  allocator_type *in_stack_ffffffffffffff78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff80;
  iterator puVar7;
  size_type sVar8;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_30;
  _Self local_18;
  HalfedgeMesh *local_10;
  
  local_10 = in_RSI;
  local_18._M_node = (_List_node_base *)facesBegin(in_stack_ffffffffffffff48);
  while( true ) {
    local_30.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)facesEnd(in_stack_ffffffffffffff48);
    bVar1 = std::operator!=(&local_18,
                            (_Self *)&local_30.
                                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    pFVar2 = std::_List_iterator<CMU462::Face>::operator->
                       ((_List_iterator<CMU462::Face> *)in_stack_ffffffffffffff50);
    pHVar3 = Face::halfedge(pFVar2);
    local_30.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pHVar3->_M_node;
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_ffffffffffffff50);
    pHVar3 = Halfedge::next(pHVar4);
    local_30.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pHVar3->_M_node;
    do {
      in_stack_ffffffffffffff50 = &local_30;
      in_stack_ffffffffffffff48 = local_10;
      pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_ffffffffffffff50);
      Halfedge::vertex(pHVar4);
      pVVar5 = std::_List_iterator<CMU462::Vertex>::operator->
                         ((_List_iterator<CMU462::Vertex> *)in_stack_ffffffffffffff50);
      puVar7 = (iterator)pVVar5->index;
      pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_ffffffffffffff50);
      Halfedge::edge(pHVar4);
      pEVar6 = std::_List_iterator<CMU462::Edge>::operator->
                         ((_List_iterator<CMU462::Edge> *)0x246252);
      sVar8 = pEVar6->index;
      std::_List_iterator<CMU462::Face>::operator->
                ((_List_iterator<CMU462::Face> *)in_stack_ffffffffffffff50);
      pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_ffffffffffffff50);
      Halfedge::edge(pHVar4);
      std::_List_iterator<CMU462::Edge>::operator->((_List_iterator<CMU462::Edge> *)0x24628e);
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2462b9);
      __l._M_len = sVar8;
      __l._M_array = puVar7;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (in_stack_ffffffffffffff80,__l,in_stack_ffffffffffffff78);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back(in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_RDI);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2462f8);
      pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_ffffffffffffff50);
      pHVar3 = Halfedge::next(pHVar4);
      local_30.
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)pHVar3->_M_node;
      pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_stack_ffffffffffffff50);
      pHVar3 = Halfedge::next(pHVar4);
      local_30.
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pHVar3->_M_node;
      pFVar2 = std::_List_iterator<CMU462::Face>::operator->
                         ((_List_iterator<CMU462::Face> *)in_stack_ffffffffffffff50);
      pHVar3 = Face::halfedge(pFVar2);
      bVar1 = std::operator!=((_Self *)&local_30.
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,pHVar3);
    } while (bVar1);
    std::_List_iterator<CMU462::Face>::operator++(&local_18,0);
  }
  return;
}

Assistant:

void HalfedgeMesh::buildSubdivisionFaceList(vector<vector<Index> >& subDFaces) {
	// TODO This routine is perhaps the most tricky step in the construction of
	// a subdivision mesh (second, perhaps, to computing the actual Catmull-Clark
	// vertex positions).  Basically what you want to do is iterate over faces,
	// then for each for each face, append N quads to the list (where N is the
	// degree of the face).  For this routine, it may be more convenient to simply
	// append quads to the end of the list (rather than allocating it ahead of
	// time), though YMMV.  You can of course iterate around a face by starting
	// with its first halfedge and following the "next" pointer until you get
	// back to the beginning.  The tricky part is making sure you grab the right
	// indices in the right order---remember that there are indices on vertices,
	// edges, AND faces of the original mesh.  All of these should get used.  Also
	// remember that you must have FOUR indices per face, since you are making a
	// QUAD mesh!

	// TODO iterate over faces
	// TODO loop around face
	// TODO build lists of four indices for each sub-quad
	// TODO append each list of four indices to face list
	for (FaceIter f = facesBegin(); f != facesEnd(); f++) {
		HalfedgeIter it = f->halfedge();
		HalfedgeIter it2 = it->next();
		do {
			subDFaces.push_back({ it2->vertex()->index,it2->edge()->index, f->index,it->edge()->index });
			it = it->next();
			it2 = it->next();
		} while (it != f->halfedge());
	}

	//showError("buildSubdivisionFaceList() not implemented.");
}